

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysextest.cpp
# Opt level: O0

void mycallback(double deltatime,vector<unsigned_char,_std::allocator<unsigned_char>_> *message,
               void *param_3)

{
  size_type sVar1;
  ostream *poVar2;
  byte *pbVar3;
  uint local_28;
  uint i;
  uint nBytes;
  void *param_2_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *message_local;
  double deltatime_local;
  
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(message);
  for (local_28 = 0; local_28 < (uint)sVar1; local_28 = local_28 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Byte ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_28);
    poVar2 = std::operator<<(poVar2," = ");
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(message,(ulong)local_28)
    ;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)*pbVar3);
    std::operator<<(poVar2,", ");
  }
  if ((uint)sVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"stamp = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,deltatime);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void mycallback( double deltatime, std::vector< unsigned char > *message, void * /*userData*/ )
{
  unsigned int nBytes = message->size();
  for ( unsigned int i=0; i<nBytes; i++ )
    std::cout << "Byte " << i << " = " << (int)message->at(i) << ", ";
  if ( nBytes > 0 )
    std::cout << "stamp = " << deltatime << std::endl;
}